

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O1

bool FileCommit(FILE *file)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined8 in_stack_ffffffffffffffc8;
  int err;
  long *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  long local_20 [2];
  long local_10;
  
  err = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = fflush((FILE *)file);
  if (iVar1 == 0) {
    iVar1 = fileno((FILE *)file);
    iVar1 = fdatasync(iVar1);
    bVar3 = true;
    if (iVar1 == 0) goto LAB_0076cd89;
    piVar2 = __errno_location();
    if (*piVar2 == 0x16) goto LAB_0076cd89;
    SysErrorString_abi_cxx11_(err);
    logging_function_00._M_str = "FileCommit";
    logging_function_00._M_len = 10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
    ;
    source_file_00._M_len = 0x5c;
    LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x7f,
               IPC|QT|LIBEVENT|PROXY|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|HTTP|MEMPOOL|TOR,
               (Level)&stack0xffffffffffffffd0,(char *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffd8);
  }
  else {
    __errno_location();
    SysErrorString_abi_cxx11_(err);
    logging_function._M_str = "FileCommit";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
    ;
    source_file._M_len = 0x5c;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x6f,
               IPC|QT|LIBEVENT|PROXY|RAND|REINDEX|SELECTCOINS|RPC|WALLETDB|ZMQ|BENCH|HTTP|TOR|NET,
               (Level)&stack0xffffffffffffffd0,(char *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffd8);
  }
  if (in_stack_ffffffffffffffd0 != local_20) {
    operator_delete(in_stack_ffffffffffffffd0,local_20[0] + 1);
  }
  bVar3 = false;
LAB_0076cd89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FileCommit(FILE* file)
{
    if (fflush(file) != 0) { // harmless if redundantly called
        LogPrintf("fflush failed: %s\n", SysErrorString(errno));
        return false;
    }
#ifdef WIN32
    HANDLE hFile = (HANDLE)_get_osfhandle(_fileno(file));
    if (FlushFileBuffers(hFile) == 0) {
        LogPrintf("FlushFileBuffers failed: %s\n", Win32ErrorString(GetLastError()));
        return false;
    }
#elif defined(MAC_OSX) && defined(F_FULLFSYNC)
    if (fcntl(fileno(file), F_FULLFSYNC, 0) == -1) { // Manpage says "value other than -1" is returned on success
        LogPrintf("fcntl F_FULLFSYNC failed: %s\n", SysErrorString(errno));
        return false;
    }
#elif HAVE_FDATASYNC
    if (fdatasync(fileno(file)) != 0 && errno != EINVAL) { // Ignore EINVAL for filesystems that don't support sync
        LogPrintf("fdatasync failed: %s\n", SysErrorString(errno));
        return false;
    }
#else
    if (fsync(fileno(file)) != 0 && errno != EINVAL) {
        LogPrintf("fsync failed: %s\n", SysErrorString(errno));
        return false;
    }
#endif
    return true;
}